

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

UniValue * __thiscall
DescribeAddressVisitor::operator()(DescribeAddressVisitor *this,WitnessV1Taproot *tap)

{
  Span<const_unsigned_char> s;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *obj;
  UniValue *in_stack_fffffffffffffd48;
  allocator<char> *other;
  string *in_stack_fffffffffffffd58;
  Span<const_unsigned_char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  UniValue *in_stack_fffffffffffffd68;
  UniValue *val;
  UniValue *in_stack_fffffffffffffd88;
  UniValue *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 uVar1;
  allocator<char> local_235;
  undefined4 local_234;
  undefined4 in_stack_fffffffffffffdd0;
  undefined1 uVar2;
  allocator<char> in_stack_fffffffffffffdd5;
  undefined1 uVar3;
  unkbyte9 in_stack_fffffffffffffdd7;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0;
  val = (UniValue *)&stack0xffffffffffffffd8;
  std::__cxx11::string::string(in_stack_fffffffffffffd60);
  UniValue::UniValue(in_stack_fffffffffffffd68,(VType)((ulong)in_stack_fffffffffffffd60 >> 0x20),
                     in_stack_fffffffffffffd58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffd98),(char *)in_stack_fffffffffffffd90,
             (allocator<char> *)in_stack_fffffffffffffd88);
  uVar3 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffffd88,(bool *)val);
  UniValue::pushKV(in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88,val);
  UniValue::~UniValue(in_stack_fffffffffffffd48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdd7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffd98),(char *)in_stack_fffffffffffffd90,
             (allocator<char> *)in_stack_fffffffffffffd88);
  uVar2 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffffd88,(bool *)val);
  UniValue::pushKV(in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88,val);
  UniValue::~UniValue(in_stack_fffffffffffffd48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdd5);
  this_00 = (Span<const_unsigned_char> *)&stack0xfffffffffffffdd3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffd98),(char *)in_stack_fffffffffffffd90,
             (allocator<char> *)in_stack_fffffffffffffd88);
  local_234 = 1;
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffffd88,(int *)val);
  UniValue::pushKV(in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88,val);
  UniValue::~UniValue(in_stack_fffffffffffffd48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdd3);
  other = &local_235;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar1,in_stack_fffffffffffffd98),(char *)in_stack_fffffffffffffd90,
             (allocator<char> *)in_stack_fffffffffffffd88);
  Span<const_unsigned_char>::Span<WitnessV1Taproot>
            (this_00,(WitnessV1Taproot *)other,in_stack_fffffffffffffd48);
  s.m_data._4_1_ = uVar2;
  s.m_data._0_4_ = in_stack_fffffffffffffdd0;
  s.m_data._5_1_ = in_stack_fffffffffffffdd5;
  s.m_data._6_1_ = uVar3;
  s._7_9_ = in_stack_fffffffffffffdd7;
  HexStr_abi_cxx11_(s);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffd88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
  UniValue::pushKV(in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88,val);
  UniValue::~UniValue(in_stack_fffffffffffffd48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd48);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd48);
  std::allocator<char>::~allocator(&local_235);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

UniValue operator()(const WitnessV1Taproot& tap) const
    {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("isscript", true);
        obj.pushKV("iswitness", true);
        obj.pushKV("witness_version", 1);
        obj.pushKV("witness_program", HexStr(tap));
        return obj;
    }